

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioNative.cpp
# Opt level: O1

PackageInfo * chatra::emb::io::packageInfo(void)

{
  char *pcVar1;
  char *pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  PackageInfo *in_RDI;
  undefined1 *puVar5;
  initializer_list<chatra::Script> __l;
  initializer_list<chatra::NativeCallHandlerInfo> __l_00;
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  undefined4 local_9c8;
  undefined4 uStack_9c4;
  undefined1 local_9c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_9b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_9a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_990;
  code *local_980;
  undefined8 local_978;
  undefined8 local_970;
  uint local_968 [2];
  undefined4 uStack_960;
  undefined4 uStack_95c;
  uint *local_958;
  undefined8 local_950;
  uint local_948 [2];
  undefined4 uStack_940;
  undefined4 uStack_93c;
  undefined1 *local_938;
  undefined8 local_930;
  undefined1 local_928 [16];
  code *local_918;
  uint *local_910;
  undefined8 local_908;
  uint local_900 [2];
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  uint *local_8f0;
  undefined8 local_8e8;
  uint local_8e0 [2];
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined1 *local_8d0;
  undefined8 local_8c8;
  undefined1 local_8c0 [16];
  code *local_8b0;
  uint *local_8a8;
  undefined8 local_8a0;
  uint local_898 [2];
  undefined4 uStack_890;
  undefined4 uStack_88c;
  uint *local_888;
  undefined8 local_880;
  uint local_878 [2];
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined1 *local_868;
  undefined8 local_860;
  undefined1 local_858 [16];
  code *local_848;
  uint *local_840;
  undefined8 local_838;
  uint local_830 [2];
  undefined4 uStack_828;
  undefined4 uStack_824;
  uint *local_820;
  undefined8 local_818;
  uint local_810 [2];
  undefined4 uStack_808;
  undefined4 uStack_804;
  undefined1 *local_800;
  undefined8 local_7f8;
  undefined1 local_7f0 [16];
  code *local_7e0;
  uint *local_7d8;
  undefined8 local_7d0;
  uint local_7c8 [2];
  undefined4 uStack_7c0;
  undefined4 uStack_7bc;
  uint *local_7b8;
  undefined8 local_7b0;
  uint local_7a8 [2];
  undefined4 uStack_7a0;
  undefined4 uStack_79c;
  undefined1 *local_798;
  undefined8 local_790;
  undefined1 local_788 [16];
  code *local_778;
  uint *local_770;
  undefined8 local_768;
  uint local_760 [2];
  undefined4 uStack_758;
  undefined4 uStack_754;
  uint *local_750;
  undefined8 local_748;
  uint local_740 [2];
  undefined4 uStack_738;
  undefined4 uStack_734;
  undefined1 *local_730;
  undefined8 local_728;
  undefined1 local_720 [16];
  code *local_710;
  uint *local_708;
  undefined8 local_700;
  uint local_6f8 [2];
  undefined4 uStack_6f0;
  undefined4 uStack_6ec;
  uint *local_6e8;
  undefined8 local_6e0;
  uint local_6d8 [2];
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined1 *local_6c8;
  undefined8 local_6c0;
  undefined1 local_6b8 [16];
  code *local_6a8;
  uint *local_6a0;
  undefined8 local_698;
  uint local_690 [2];
  undefined4 uStack_688;
  undefined4 uStack_684;
  uint *local_680;
  undefined8 local_678;
  uint local_670 [2];
  undefined4 uStack_668;
  undefined4 uStack_664;
  undefined1 *local_660;
  undefined8 local_658;
  undefined1 local_650 [16];
  code *local_640;
  uint *local_638;
  undefined8 local_630;
  uint local_628 [2];
  undefined4 uStack_620;
  undefined4 uStack_61c;
  uint *local_618;
  undefined8 local_610;
  uint local_608 [2];
  undefined4 uStack_600;
  undefined4 uStack_5fc;
  undefined1 *local_5f8;
  undefined8 local_5f0;
  undefined1 local_5e8 [16];
  code *local_5d8;
  uint *local_5d0;
  undefined8 local_5c8;
  uint local_5c0 [2];
  undefined4 uStack_5b8;
  undefined4 uStack_5b4;
  uint *local_5b0;
  undefined8 local_5a8;
  uint local_5a0 [2];
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined1 *local_590;
  undefined8 local_588;
  undefined1 local_580 [16];
  code *local_570;
  uint *local_568;
  undefined8 local_560;
  uint local_558 [2];
  undefined4 uStack_550;
  undefined4 uStack_54c;
  uint *local_548;
  undefined8 local_540;
  uint local_538 [2];
  undefined4 uStack_530;
  undefined4 uStack_52c;
  undefined1 *local_528;
  undefined8 local_520;
  undefined1 local_518 [16];
  code *local_508;
  char *local_500;
  size_type local_4f8;
  char local_4f0 [8];
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  uint *local_4e0;
  undefined8 local_4d8;
  uint local_4d0 [2];
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined1 *local_4c0;
  undefined8 local_4b8;
  undefined1 local_4b0 [16];
  code *local_4a0;
  char *local_498;
  size_type local_490;
  char local_488 [8];
  undefined8 uStack_480;
  undefined1 *local_478;
  undefined8 local_470;
  undefined1 local_468 [8];
  undefined8 uStack_460;
  undefined1 *local_458;
  undefined8 local_450;
  undefined1 local_448 [16];
  undefined1 local_438 [8];
  vector<chatra::Script,_std::allocator<chatra::Script>_> scripts;
  vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> handlers;
  undefined1 local_3f8 [16];
  char *local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  _Alloc_hider _Stack_3d0;
  char *local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  char *local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  undefined8 uStack_390;
  undefined1 *local_388;
  undefined8 local_380;
  undefined1 local_378 [8];
  undefined8 uStack_370;
  uint *local_368;
  NativeCallHandler local_360;
  uint local_358 [2];
  undefined4 uStack_350;
  undefined4 uStack_34c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_348;
  undefined8 local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  uint *local_328;
  undefined8 local_320;
  uint local_318 [2];
  undefined4 uStack_310;
  undefined4 uStack_30c;
  uint *local_308;
  undefined8 local_300;
  uint local_2f8 [2];
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  uint *local_2e8;
  undefined8 local_2e0;
  uint local_2d8 [2];
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  uint *local_2c8;
  undefined8 local_2c0;
  uint local_2b8 [2];
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  uint *local_2a8;
  undefined8 local_2a0;
  uint local_298 [2];
  undefined4 uStack_290;
  undefined4 uStack_28c;
  uint *local_288;
  undefined8 local_280;
  uint local_278 [2];
  undefined4 uStack_270;
  undefined4 uStack_26c;
  uint *local_268;
  undefined8 local_260;
  uint local_258 [2];
  undefined4 uStack_250;
  undefined4 uStack_24c;
  uint *local_248;
  undefined8 local_240;
  uint local_238 [2];
  undefined4 uStack_230;
  undefined4 uStack_22c;
  uint *local_228;
  undefined8 local_220;
  uint local_218 [2];
  undefined4 uStack_210;
  undefined4 uStack_20c;
  uint *local_208;
  undefined8 local_200;
  uint local_1f8 [2];
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8 [2];
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8 [2];
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  uint *local_1a8;
  undefined8 local_1a0;
  uint local_198 [2];
  undefined4 uStack_190;
  undefined4 uStack_18c;
  uint *local_188;
  undefined8 local_180;
  uint local_178 [2];
  undefined4 uStack_170;
  undefined4 uStack_16c;
  uint *local_168;
  undefined8 local_160;
  uint local_158 [2];
  undefined4 uStack_150;
  undefined4 uStack_14c;
  uint *local_148;
  undefined8 local_140;
  uint local_138 [2];
  undefined4 uStack_130;
  undefined4 uStack_12c;
  uint *local_128;
  undefined8 local_120;
  uint local_118 [2];
  undefined4 uStack_110;
  undefined4 uStack_10c;
  uint *local_108;
  undefined8 local_100;
  uint local_f8 [2];
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  uint *local_e8;
  undefined8 local_e0;
  uint local_d8 [2];
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  uint *local_c8;
  undefined8 local_c0;
  uint local_b8 [2];
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  uint *local_a8;
  undefined8 local_a0;
  uint local_98 [2];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  uint *local_88;
  undefined8 local_80;
  uint local_78 [2];
  undefined4 uStack_70;
  undefined4 uStack_6c;
  uint *local_68;
  undefined8 local_60;
  uint local_58 [2];
  undefined4 uStack_50;
  undefined4 uStack_4c;
  PackageInfo *local_48;
  allocator_type local_39 [9];
  
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)
             &handlers.
              super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"io","");
  pcVar1 = local_3e0._M_local_buf + 8;
  local_3e8 = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3e8,
             "\n/*\n * Programming language \'Chatra\' reference implementation\n *\n * Copyright(C) 2019-2020 Chatra Project Team\n *\n * Licensed under the Apache License, Version 2.0 (the \"License\");\n * you may not use this file except in compliance with the License.\n * You may obtain a copy of the License at\n *\n *   http://www.apache.org/licenses/LICENSE-2.0\n *\n * Unless required by applicable law or agreed to in writing, software\n * distributed under the License is distributed on an \"AS IS\" BASIS,\n * WITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\n * See the License for the specific language governing permissions and\n * limitations under the License.\n *\n * author: Satoshi Hosokawa (chatra.hosokawa@gmail.com)\n */\n\nimport containers\n\nclass Stream\n\tdef close()\n\n\nclass InputStream extends Stream\n\tdef init()\n\t\tsuper()\n\n\tdef available()\n\t\treturn 0\n\n\tdef read(buffer: ByteArray, offset: 0, length: -1)\n\t\tthrow UnsupportedOperationException()\n\n\tdef skip(length: Int)\n\t\treturn read(ByteArray().resize(length))\n\n\nclass OutputStream extends Stream\n\tdef init()\n\t\tsuper()\n\n\tdef flush()\n\n\tdef write(buffer: ByteArray, offset: 0, length: -1)\n\t\tthrow UnsupportedOperationException()\n\n\nclass RandomAccessStream extends Stream\n\tdef init()\n\t\tsuper()\n\n\tdef seek(offset: Int; begin: false, end: false, current: false)  // default is current\n\t\tthrow UnsupportedOperationException()\n\n\tdef position()\n\t\tthrow UnsupportedOperationException()\n\n\nclass FileInputStream extends InputStream, RandomAccessStream\n\tdef _init_instance(fileName, kwargs) as native\n\n\tdef init(fileName: String; kwargs...)\n\t\tif fileName == null\n\t\t\tthrow IllegalArgumentException()\n\t\tsuper.InputStream()\n\t\tsuper.RandomAccessStream()\n\t\t_init_instance(fileName, kwargs)\n\n\tdef close() as native\n\n\tdef available() as native\n\n\tdef _native_read(buffer, offset, length) as native\n\n\tdef read(buffer: ByteArray, offset: 0, length: -1)\n\t\tif buffer == null\n\t\t\tthrow IllegalArgumentException()\n\t\treturn _native_read(buffer, offset, length)\n\n\tdef skip(length: Int)\n\t    if length < 0\n\t        thr..." /* TRUNCATED STRING LITERAL */
             ,"");
  if (handlers.
      super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)local_3f8) {
    local_9d8._8_8_ = local_3f8._8_8_;
    local_9e8._0_8_ = (pointer)local_9d8;
  }
  else {
    local_9e8._0_8_ =
         handlers.
         super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
  }
  local_3f8[0] = 0;
  if (local_3e8 == pcVar1) {
    aStack_9b0._0_8_ = _Stack_3d0._M_p;
    _local_9c8 = local_9c0 + 8;
  }
  else {
    _local_9c8 = local_3e8;
  }
  local_9c0._0_8_ = local_3e0._M_allocated_capacity;
  local_3e0._M_allocated_capacity = 0;
  local_3e0._M_local_buf[8] = '\0';
  __l._M_len = 1;
  __l._M_array = (iterator)local_9e8;
  handlers.
  super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3f8;
  local_3e8 = pcVar1;
  local_48 = in_RDI;
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_438,__l,
             (allocator_type *)
             &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if ((undefined1 *)_local_9c8 != local_9c0 + 8) {
    operator_delete((void *)_local_9c8);
  }
  if ((pointer)local_9e8._0_8_ != (pointer)local_9d8) {
    operator_delete((void *)local_9e8._0_8_);
  }
  if (local_3e8 != pcVar1) {
    operator_delete(local_3e8);
  }
  if (handlers.
      super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)local_3f8) {
    operator_delete(handlers.
                    super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  local_368 = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"FileInputStream","");
  local_348 = &local_338;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"_init_instance","");
  local_9e8._8_8_ = local_9d8 + 8;
  local_9e8._0_8_ = fileInputStream_initInstance;
  if (local_368 == local_358) {
    uStack_9c4 = uStack_34c;
    local_9c8 = uStack_350;
  }
  else {
    local_9e8._8_8_ = local_368;
  }
  local_9c0._0_8_ = &aStack_9b0;
  local_9d8._0_8_ = local_360;
  local_360 = (NativeCallHandler)0x0;
  local_358[0] = local_358[0] & 0xffffff00;
  if (local_348 == &local_338) {
    aStack_9b0._8_4_ = local_338._8_4_;
    aStack_9b0._12_4_ = local_338._12_4_;
  }
  else {
    local_9c0._0_8_ = local_348;
  }
  local_9a0._M_allocated_capacity = (size_type)&local_990;
  local_9c0._8_8_ = local_340;
  local_340 = 0;
  local_338._M_allocated_capacity._0_4_ = local_338._M_allocated_capacity._0_4_ & 0xffffff00;
  local_9a0._8_8_ = 0;
  local_990._M_local_buf[0] = '\0';
  local_368 = local_358;
  local_348 = &local_338;
  local_328 = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"FileInputStream","");
  local_308 = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"close","");
  local_978 = local_968;
  local_980 = fileInputStream_close;
  if (local_328 == local_318) {
    uStack_960 = uStack_310;
    uStack_95c = uStack_30c;
  }
  else {
    local_978 = local_328;
  }
  local_958 = local_948;
  local_970 = local_320;
  local_320 = 0;
  local_318[0] = local_318[0] & 0xffffff00;
  if (local_308 == local_2f8) {
    uStack_940 = uStack_2f0;
    uStack_93c = uStack_2ec;
  }
  else {
    local_958 = local_308;
  }
  local_938 = local_928;
  local_950 = local_300;
  local_300 = 0;
  local_2f8[0] = local_2f8[0] & 0xffffff00;
  local_930 = 0;
  local_928[0] = 0;
  local_328 = local_318;
  local_308 = local_2f8;
  local_2e8 = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"FileInputStream","");
  local_2c8 = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"available","");
  local_910 = local_900;
  local_918 = fileInputStream_available;
  if (local_2e8 == local_2d8) {
    uStack_8f8 = uStack_2d0;
    uStack_8f4 = uStack_2cc;
  }
  else {
    local_910 = local_2e8;
  }
  local_8f0 = local_8e0;
  local_908 = local_2e0;
  local_2e0 = 0;
  local_2d8[0] = local_2d8[0] & 0xffffff00;
  if (local_2c8 == local_2b8) {
    uStack_8d8 = uStack_2b0;
    uStack_8d4 = uStack_2ac;
  }
  else {
    local_8f0 = local_2c8;
  }
  local_8d0 = local_8c0;
  local_8e8 = local_2c0;
  local_2c0 = 0;
  local_2b8[0] = local_2b8[0] & 0xffffff00;
  local_8c8 = 0;
  local_8c0[0] = 0;
  local_2e8 = local_2d8;
  local_2c8 = local_2b8;
  local_2a8 = local_298;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"FileInputStream","");
  local_288 = local_278;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"_native_read","");
  local_8a8 = local_898;
  local_8b0 = fileInputStream_read;
  if (local_2a8 == local_298) {
    uStack_890 = uStack_290;
    uStack_88c = uStack_28c;
  }
  else {
    local_8a8 = local_2a8;
  }
  local_888 = local_878;
  local_8a0 = local_2a0;
  local_2a0 = 0;
  local_298[0] = local_298[0] & 0xffffff00;
  if (local_288 == local_278) {
    uStack_870 = uStack_270;
    uStack_86c = uStack_26c;
  }
  else {
    local_888 = local_288;
  }
  local_868 = local_858;
  local_880 = local_280;
  local_280 = 0;
  local_278[0] = local_278[0] & 0xffffff00;
  local_860 = 0;
  local_858[0] = 0;
  local_2a8 = local_298;
  local_288 = local_278;
  local_268 = local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"FileInputStream","");
  local_248 = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"_native_seek","");
  local_840 = local_830;
  local_848 = fileInputStream_seek;
  if (local_268 == local_258) {
    uStack_828 = uStack_250;
    uStack_824 = uStack_24c;
  }
  else {
    local_840 = local_268;
  }
  local_820 = local_810;
  local_838 = local_260;
  local_260 = 0;
  local_258[0] = local_258[0] & 0xffffff00;
  if (local_248 == local_238) {
    uStack_808 = uStack_230;
    uStack_804 = uStack_22c;
  }
  else {
    local_820 = local_248;
  }
  local_800 = local_7f0;
  local_818 = local_240;
  local_240 = 0;
  local_238[0] = local_238[0] & 0xffffff00;
  local_7f8 = 0;
  local_7f0[0] = 0;
  local_268 = local_258;
  local_248 = local_238;
  local_228 = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"FileInputStream","");
  local_208 = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"position","");
  local_7d8 = local_7c8;
  local_7e0 = fileInputStream_position;
  if (local_228 == local_218) {
    uStack_7c0 = uStack_210;
    uStack_7bc = uStack_20c;
  }
  else {
    local_7d8 = local_228;
  }
  local_7b8 = local_7a8;
  local_7d0 = local_220;
  local_220 = 0;
  local_218[0] = local_218[0] & 0xffffff00;
  if (local_208 == local_1f8) {
    uStack_7a0 = uStack_1f0;
    uStack_79c = uStack_1ec;
  }
  else {
    local_7b8 = local_208;
  }
  local_798 = local_788;
  local_7b0 = local_200;
  local_200 = 0;
  local_1f8[0] = local_1f8[0] & 0xffffff00;
  local_790 = 0;
  local_788[0] = 0;
  local_228 = local_218;
  local_208 = local_1f8;
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"FileOutputStream","");
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"_init_instance","");
  local_770 = local_760;
  local_778 = fileOutputStream_initInstance;
  if (local_1e8 == local_1d8) {
    uStack_758 = uStack_1d0;
    uStack_754 = uStack_1cc;
  }
  else {
    local_770 = local_1e8;
  }
  local_750 = local_740;
  local_768 = local_1e0;
  local_1e0 = 0;
  local_1d8[0] = local_1d8[0] & 0xffffff00;
  if (local_1c8 == local_1b8) {
    uStack_738 = uStack_1b0;
    uStack_734 = uStack_1ac;
  }
  else {
    local_750 = local_1c8;
  }
  local_730 = local_720;
  local_748 = local_1c0;
  local_1c0 = 0;
  local_1b8[0] = local_1b8[0] & 0xffffff00;
  local_728 = 0;
  local_720[0] = 0;
  local_1e8 = local_1d8;
  local_1c8 = local_1b8;
  local_1a8 = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"FileOutputStream","");
  local_188 = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"close","");
  local_708 = local_6f8;
  local_710 = fileOutputStream_close;
  if (local_1a8 == local_198) {
    uStack_6f0 = uStack_190;
    uStack_6ec = uStack_18c;
  }
  else {
    local_708 = local_1a8;
  }
  local_6e8 = local_6d8;
  local_700 = local_1a0;
  local_1a0 = 0;
  local_198[0] = local_198[0] & 0xffffff00;
  if (local_188 == local_178) {
    uStack_6d0 = uStack_170;
    uStack_6cc = uStack_16c;
  }
  else {
    local_6e8 = local_188;
  }
  local_6c8 = local_6b8;
  local_6e0 = local_180;
  local_180 = 0;
  local_178[0] = local_178[0] & 0xffffff00;
  local_6c0 = 0;
  local_6b8[0] = 0;
  local_1a8 = local_198;
  local_188 = local_178;
  local_168 = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"FileOutputStream","");
  local_148 = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"flush","");
  local_6a0 = local_690;
  local_6a8 = fileOutputStream_flush;
  if (local_168 == local_158) {
    uStack_688 = uStack_150;
    uStack_684 = uStack_14c;
  }
  else {
    local_6a0 = local_168;
  }
  local_680 = local_670;
  local_698 = local_160;
  local_160 = 0;
  local_158[0] = local_158[0] & 0xffffff00;
  if (local_148 == local_138) {
    uStack_668 = uStack_130;
    uStack_664 = uStack_12c;
  }
  else {
    local_680 = local_148;
  }
  local_660 = local_650;
  local_678 = local_140;
  local_140 = 0;
  local_138[0] = local_138[0] & 0xffffff00;
  local_658 = 0;
  local_650[0] = 0;
  local_168 = local_158;
  local_148 = local_138;
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"FileOutputStream","");
  local_108 = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"_native_write","");
  local_638 = local_628;
  local_640 = fileOutputStream_write;
  if (local_128 == local_118) {
    uStack_620 = uStack_110;
    uStack_61c = uStack_10c;
  }
  else {
    local_638 = local_128;
  }
  local_618 = local_608;
  local_630 = local_120;
  local_120 = 0;
  local_118[0] = local_118[0] & 0xffffff00;
  if (local_108 == local_f8) {
    uStack_600 = uStack_f0;
    uStack_5fc = uStack_ec;
  }
  else {
    local_618 = local_108;
  }
  local_5f8 = local_5e8;
  local_610 = local_100;
  local_100 = 0;
  local_f8[0] = local_f8[0] & 0xffffff00;
  local_5f0 = 0;
  local_5e8[0] = 0;
  local_128 = local_118;
  local_108 = local_f8;
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"FileOutputStream","");
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"_native_seek","");
  local_5d0 = local_5c0;
  local_5d8 = fileOutputStream_seek;
  if (local_e8 == local_d8) {
    uStack_5b8 = uStack_d0;
    uStack_5b4 = uStack_cc;
  }
  else {
    local_5d0 = local_e8;
  }
  local_5b0 = local_5a0;
  local_5c8 = local_e0;
  local_e0 = 0;
  local_d8[0] = local_d8[0] & 0xffffff00;
  if (local_c8 == local_b8) {
    uStack_598 = uStack_b0;
    uStack_594 = uStack_ac;
  }
  else {
    local_5b0 = local_c8;
  }
  local_590 = local_580;
  local_5a8 = local_c0;
  local_c0 = 0;
  local_b8[0] = local_b8[0] & 0xffffff00;
  local_588 = 0;
  local_580[0] = 0;
  local_e8 = local_d8;
  local_c8 = local_b8;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"FileOutputStream","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"position","");
  local_568 = local_558;
  local_570 = fileOutputStream_position;
  if (local_a8 == local_98) {
    uStack_550 = uStack_90;
    uStack_54c = uStack_8c;
  }
  else {
    local_568 = local_a8;
  }
  local_548 = local_538;
  local_560 = local_a0;
  local_a0 = 0;
  local_98[0] = local_98[0] & 0xffffff00;
  if (local_88 == local_78) {
    uStack_530 = uStack_70;
    uStack_52c = uStack_6c;
  }
  else {
    local_548 = local_88;
  }
  local_528 = local_518;
  local_540 = local_80;
  local_80 = 0;
  local_78[0] = local_78[0] & 0xffffff00;
  local_520 = 0;
  local_518[0] = 0;
  pcVar1 = local_3c0._M_local_buf + 8;
  local_3c8 = pcVar1;
  local_a8 = local_98;
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Reader","");
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"_convertToString","");
  local_500 = local_4f0;
  local_508 = reader_convertToString;
  if (local_3c8 == pcVar1) {
    uStack_4e8 = uStack_3b0;
    uStack_4e4 = uStack_3ac;
  }
  else {
    local_500 = local_3c8;
  }
  local_4e0 = local_4d0;
  local_4f8 = local_3c0._M_allocated_capacity;
  local_3c0._M_allocated_capacity = 0;
  local_3c0._8_4_ = local_3c0._8_4_ & 0xffffff00;
  if (local_68 == local_58) {
    uStack_4c8 = uStack_50;
    uStack_4c4 = uStack_4c;
  }
  else {
    local_4e0 = local_68;
  }
  local_4c0 = local_4b0;
  local_4d8 = local_60;
  local_60 = 0;
  local_58[0] = local_58[0] & 0xffffff00;
  local_4b8 = 0;
  local_4b0[0] = 0;
  pcVar2 = local_3a0._M_local_buf + 8;
  local_3c8 = pcVar1;
  local_3a8 = pcVar2;
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"Writer","");
  local_388 = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"_convertToUtf8","");
  local_498 = local_488;
  local_4a0 = writer_convertToUtf8;
  if (local_3a8 == pcVar2) {
    uStack_480 = uStack_390;
  }
  else {
    local_498 = local_3a8;
  }
  local_478 = local_468;
  local_490 = local_3a0._M_allocated_capacity;
  local_3a0._M_allocated_capacity = 0;
  local_3a0._M_local_buf[8] = '\0';
  if (local_388 == local_378) {
    uStack_460 = uStack_370;
  }
  else {
    local_478 = local_388;
  }
  puVar5 = local_448;
  local_470 = local_380;
  local_380 = 0;
  local_378[0] = 0;
  local_450 = 0;
  local_448[0] = 0;
  __l_00._M_len = 0xe;
  __l_00._M_array = (iterator)local_9e8;
  local_458 = puVar5;
  local_3a8 = pcVar2;
  local_388 = local_378;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            ((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,__l_00,local_39);
  lVar4 = -0x5b0;
  do {
    if (puVar5 != *(undefined1 **)(puVar5 + -0x10)) {
      operator_delete(*(undefined1 **)(puVar5 + -0x10));
    }
    if (puVar5 + -0x20 != *(undefined1 **)(puVar5 + -0x30)) {
      operator_delete(*(undefined1 **)(puVar5 + -0x30));
    }
    if (puVar5 + -0x40 != *(undefined1 **)(puVar5 + -0x50)) {
      operator_delete(*(undefined1 **)(puVar5 + -0x50));
    }
    puVar5 = puVar5 + -0x68;
    lVar4 = lVar4 + 0x68;
  } while (lVar4 != 0);
  if (local_388 != local_378) {
    operator_delete(local_388);
  }
  if (local_3a8 != pcVar2) {
    operator_delete(local_3a8);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  if (local_3c8 != pcVar1) {
    operator_delete(local_3c8);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  if (local_148 != local_138) {
    operator_delete(local_148);
  }
  if (local_168 != local_158) {
    operator_delete(local_168);
  }
  if (local_188 != local_178) {
    operator_delete(local_188);
  }
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208);
  }
  if (local_228 != local_218) {
    operator_delete(local_228);
  }
  if (local_248 != local_238) {
    operator_delete(local_248);
  }
  if (local_268 != local_258) {
    operator_delete(local_268);
  }
  if (local_288 != local_278) {
    operator_delete(local_288);
  }
  if (local_2a8 != local_298) {
    operator_delete(local_2a8);
  }
  if (local_2c8 != local_2b8) {
    operator_delete(local_2c8);
  }
  if (local_2e8 != local_2d8) {
    operator_delete(local_2e8);
  }
  if (local_308 != local_2f8) {
    operator_delete(local_308);
  }
  if (local_328 != local_318) {
    operator_delete(local_328);
  }
  if (local_348 != &local_338) {
    operator_delete(local_348);
  }
  if (local_368 != local_358) {
    operator_delete(local_368);
  }
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            (&local_48->scripts,(vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_438
            );
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            (&local_48->handlers,
             (vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0024aad8;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR__IPackage_0024ab28;
  (local_48->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var3 + 1);
  (local_48->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var3;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
  ~vector((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> *)
          &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_438);
  return local_48;
}

Assistant:

PackageInfo packageInfo() {
	std::vector<Script> scripts = {{"io", script}};
	std::vector<HandlerInfo> handlers = {
			{fileInputStream_initInstance, "FileInputStream", "_init_instance"},
			{fileInputStream_close, "FileInputStream", "close"},
			{fileInputStream_available, "FileInputStream", "available"},
			{fileInputStream_read, "FileInputStream", "_native_read"},
			{fileInputStream_seek, "FileInputStream", "_native_seek"},
			{fileInputStream_position, "FileInputStream", "position"},
			{fileOutputStream_initInstance, "FileOutputStream", "_init_instance"},
			{fileOutputStream_close, "FileOutputStream", "close"},
			{fileOutputStream_flush, "FileOutputStream", "flush"},
			{fileOutputStream_write, "FileOutputStream", "_native_write"},
			{fileOutputStream_seek, "FileOutputStream", "_native_seek"},
			{fileOutputStream_position, "FileOutputStream", "position"},
			{reader_convertToString, "Reader", "_convertToString"},
			{writer_convertToUtf8, "Writer", "_convertToUtf8"},
	};
	return {scripts, handlers, std::make_shared<IoPackageInterface>()};
}